

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O2

void __thiscall
tst_deprecations_helpers_qpromiseall::allPromisesSucceed(tst_deprecations_helpers_qpromiseall *this)

{
  QSharedData *pQVar1;
  char cVar2;
  bool bVar3;
  PromiseData<int> *this_00;
  QThread *p_00;
  QObject *pQVar4;
  QEvent *this_01;
  long lVar5;
  initializer_list<QtPromise::QPromise<int>_> args;
  initializer_list<int> args_00;
  QArrayDataPointer<QtPromise::QPromise<int>_> local_e8;
  QPromise<int> p2;
  QArrayDataPointer<int> local_b8;
  PromiseData<int> *local_a0;
  undefined **local_98;
  PromiseData<int> *local_90;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_88;
  undefined4 local_80;
  QPromise<QList<int>_> p;
  QWeakPointer<QObject> local_68;
  PromiseResolver<int> resolver;
  Type p1;
  Type p0;
  
  local_b8.d._0_4_ = 0x2a;
  QtPromise::resolve<int>((QtPromise *)&p0,(int *)&local_b8);
  local_b8.d = (Data *)CONCAT44(local_b8.d._4_4_,0x2c);
  QtPromise::resolve<int>((QtPromise *)&p1,(int *)&local_b8);
  p2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128950;
  this_00 = (PromiseData<int> *)operator_new(0x68);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(this_00);
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8.d = (Data *)&PTR__QPromiseBase_00128bc8;
  p2.super_QPromiseBase<int>.m_d.d = this_00;
  local_b8.ptr = (int *)this_00;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_b8);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_b8);
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_88.d = (Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8.d = (Data *)resolver.m_d.d;
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)resolver.m_d.d;
  p_00 = (QThread *)QThread::currentThread();
  QPointer<QThread>::QPointer((QPointer<QThread> *)&local_68,p_00);
  if (((local_68.d != (Data *)0x0) &&
      (local_68.value != (QObject *)0x0 &&
       ((local_68.d)->strongref)._q_value.super___atomic_base<int>._M_i != 0)) &&
     (cVar2 = QThread::isFinished(), cVar2 == '\0')) {
    if ((local_68.d == (Data *)0x0) ||
       (((local_68.d)->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
      local_68.value = (QObject *)0x0;
    }
    pQVar4 = (QObject *)QAbstractEventDispatcher::instance((QThread *)local_68.value);
    if ((pQVar4 != (QObject *)0x0) || (cVar2 = QCoreApplication::closingDown(), cVar2 == '\0')) {
      this_01 = (QEvent *)operator_new(0x18);
      QEvent::QEvent(this_01,None);
      *(undefined ***)this_01 = &PTR__Event_001286e0;
      *(Data **)(this_01 + 0x10) = local_e8.d;
      if ((Data *)local_e8.d != (Data *)0x0) {
        LOCK();
        (((QSharedData *)&(local_e8.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             (((QSharedData *)&(local_e8.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QCoreApplication::postEvent(pQVar4,this_01,0);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_68);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&local_e8
            );
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&p);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_88);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  p2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128bc8;
  local_b8.ptr = (int *)p0.super_QPromiseBase<int>.m_d.d;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8.d = (Data *)&PTR__QPromiseBase_00128bc8;
  local_a0 = p2.super_QPromiseBase<int>.m_d.d;
  if (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8.size = (qsizetype)&PTR__QPromiseBase_00128bc8;
  local_90 = p1.super_QPromiseBase<int>.m_d.d;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98 = &PTR__QPromiseBase_00128bc8;
  args._M_len = 3;
  args._M_array = (iterator)&local_b8;
  QList<QtPromise::QPromise<int>_>::QList((QList<QtPromise::QPromise<int>_> *)&local_e8,args);
  QtPromise::all<int,_QList>((QtPromise *)&p,(QList<QtPromise::QPromise<int>_> *)&local_e8);
  QArrayDataPointer<QtPromise::QPromise<int>_>::~QArrayDataPointer(&local_e8);
  lVar5 = 0x20;
  do {
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)((long)&local_b8.d + lVar5));
    lVar5 = lVar5 + -0x10;
  } while (lVar5 != -0x10);
  bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                    (&(p0.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  local_e8.d._0_1_ = 1;
  local_b8.d._0_1_ = bVar3;
  bVar3 = QTest::qCompare<bool,bool>
                    ((bool *)&local_b8,(bool *)&local_e8,"p0.isFulfilled()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0x6d);
  if (bVar3) {
    local_b8.d._0_1_ =
         QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                   (&(p1.super_QPromiseBase<int>.m_d.d)->
                     super_PromiseDataBase<int,_void_(const_int_&)>);
    local_e8.d._0_1_ = 1;
    bVar3 = QTest::qCompare<bool,bool>
                      ((bool *)&local_b8,(bool *)&local_e8,"p1.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x6e);
    if (bVar3) {
      local_b8.d._0_1_ =
           QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                     (&(p2.super_QPromiseBase<int>.m_d.d)->
                       super_PromiseDataBase<int,_void_(const_int_&)>);
      local_e8.d._0_1_ = 1;
      bVar3 = QTest::qCompare<bool,bool>
                        ((bool *)&local_b8,(bool *)&local_e8,"p2.isPending()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                         ,0x6f);
      if (bVar3) {
        local_b8.d._0_1_ =
             QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                       (&(p.super_QPromiseBase<QList<int>_>.m_d.d)->
                         super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
        local_e8.d._0_1_ = 1;
        bVar3 = QTest::qCompare<bool,bool>
                          ((bool *)&local_b8,(bool *)&local_e8,"p.isPending()","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                           ,0x70);
        if (bVar3) {
          local_e8.d._0_1_ = 0;
          local_e8.d._1_7_ = 0;
          local_e8.ptr = (QPromise<int> *)0x0;
          local_e8.size = 0;
          waitForValue<QList<int>>((QList<int> *)&local_b8,&p,(QList<int> *)&local_e8);
          local_88.d = (Data *)0x2b0000002a;
          local_80 = 0x2c;
          args_00._M_len = 3;
          args_00._M_array = (iterator)&local_88;
          QList<int>::QList((QList<int> *)&resolver,args_00);
          bVar3 = QTest::qCompare<int>
                            ((QList<int> *)&local_b8,(QList<int> *)&resolver,
                             "waitForValue(p, QVector<int>{})","(QVector<int>{42, 43, 44})",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                             ,0x71);
          QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&resolver);
          QArrayDataPointer<int>::~QArrayDataPointer(&local_b8);
          QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_e8);
          if (bVar3) {
            local_b8.d._0_1_ =
                 QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                           (&(p2.super_QPromiseBase<int>.m_d.d)->
                             super_PromiseDataBase<int,_void_(const_int_&)>);
            local_e8.d._0_1_ = 1;
            QTest::qCompare<bool,bool>
                      ((bool *)&local_b8,(bool *)&local_e8,"p2.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x72);
          }
        }
      }
    }
  }
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&p.super_QPromiseBase<QList<int>_>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p2.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p1.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p0.super_QPromiseBase<int>);
  return;
}

Assistant:

void tst_deprecations_helpers_qpromiseall::allPromisesSucceed()
{
    auto p0 = QtPromise::resolve(42);
    auto p1 = QtPromise::resolve(44);
    auto p2 = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>& resolve) {
        QtPromisePrivate::qtpromise_defer([=]() {
            resolve(43);
        });
    }};

    auto p = QtPromise::qPromiseAll(QVector<QtPromise::QPromise<int>>{p0, p2, p1});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{42, 43, 44}));
    QCOMPARE(p2.isFulfilled(), true);
}